

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ReturnStmt * __thiscall parser::Parser::parseReturnStatement(Parser *this)

{
  ReturnStmt *this_00;
  Expr *pEVar1;
  Token local_48;
  ReturnStmt *local_18;
  ReturnStmt *stmt;
  Parser *this_local;
  
  stmt = (ReturnStmt *)this;
  this_00 = (ReturnStmt *)operator_new(0x48);
  token::Token::Token(&local_48,&this->curToken);
  ast::ReturnStmt::ReturnStmt(this_00,&local_48,this->l->line);
  token::Token::~Token(&local_48);
  local_18 = this_00;
  nextToken(this);
  pEVar1 = parseExpression(this);
  local_18->returnValue = pEVar1;
  return local_18;
}

Assistant:

ReturnStmt* Parser::parseReturnStatement()
{
    ReturnStmt* stmt = new ReturnStmt(curToken, l->line);
    nextToken();
    stmt->returnValue = parseExpression();
    return stmt;
}